

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

expected<const_Command_*,_Commands::MatchFailure> * __thiscall
Commands::match(expected<const_Command_*,_Commands::MatchFailure> *__return_storage_ptr__,
               Commands *this,Alternator *alternator,optional<const_SyntaxTree_&> *cmdnode,
               MatchArgumentList *args,SymTable *symtable,shared_ptr<Scope> *scope_ptr,
               Options *options)

{
  Command *command;
  bool bVar1;
  optional<const_SyntaxTree_&> local_a8;
  MatchFailure local_a0;
  unexpected_type<Commands::MatchFailure> local_88;
  uint local_6c;
  optional<const_SyntaxTree_&> local_68;
  byte local_59;
  reference local_58;
  Command **cmd;
  const_iterator __end1;
  const_iterator __begin1;
  Alternator *__range1;
  SymTable *symtable_local;
  MatchArgumentList *args_local;
  optional<const_SyntaxTree_&> *cmdnode_local;
  Alternator *alternator_local;
  Commands *this_local;
  expected<const_Command_*,_Commands::MatchFailure> *opt_command;
  
  __end1 = std::vector<const_Command_*,_std::allocator<const_Command_*>_>::begin(alternator);
  cmd = (Command **)std::vector<const_Command_*,_std::allocator<const_Command_*>_>::end(alternator);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Command_*const_*,_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_>
                                *)&cmd);
    if (!bVar1) {
      std::experimental::optional<const_SyntaxTree_&>::optional(&local_a8,cmdnode);
      hint_from((optional<const_SyntaxTree_&> *)&local_a0);
      local_a0.reason = NoAlternativeMatch;
      nonstd::make_unexpected<Commands::MatchFailure>(&local_88,&local_a0);
      nonstd::expected<const_Command_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,&local_88);
      nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_88);
      MatchFailure::~MatchFailure(&local_a0);
      return __return_storage_ptr__;
    }
    local_58 = __gnu_cxx::
               __normal_iterator<const_Command_*const_*,_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_>
               ::operator*(&__end1);
    local_59 = 0;
    command = *local_58;
    std::experimental::optional<const_SyntaxTree_&>::optional(&local_68,cmdnode);
    match(__return_storage_ptr__,this,command,&local_68,args,symtable,scope_ptr,options);
    bVar1 = nonstd::expected::operator_cast_to_bool((expected *)__return_storage_ptr__);
    if (bVar1) {
      local_59 = 1;
    }
    local_6c = (uint)bVar1;
    if ((local_59 & 1) == 0) {
      nonstd::expected<const_Command_*,_Commands::MatchFailure>::~expected(__return_storage_ptr__);
    }
    if (local_6c != 0) break;
    __gnu_cxx::
    __normal_iterator<const_Command_*const_*,_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Commands::match(const Alternator& alternator, optional<const SyntaxTree&> cmdnode, const MatchArgumentList& args,
                     const SymTable& symtable, const shared_ptr<Scope>& scope_ptr, const Options& options) const
                                                                                                -> expected<const Command*, MatchFailure>
{
    for(auto& cmd : alternator)
    {
        if(auto opt_command = this->match(*cmd, cmdnode, args, symtable, scope_ptr, options))
            return opt_command;
    }
    return make_unexpected(MatchFailure { hint_from(cmdnode), MatchFailure::NoAlternativeMatch });
}